

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCommon.h
# Opt level: O0

void __thiscall ParserWrapper::~ParserWrapper(ParserWrapper *this)

{
  Lexer *in_RDI;
  State *in_stack_00000020;
  
  luna::Lexer::~Lexer(in_RDI);
  luna::String::~String((String *)in_RDI);
  luna::State::~State(in_stack_00000020);
  io::text::InStringStream::~InStringStream((InStringStream *)0x1a0858);
  return;
}

Assistant:

explicit ParserWrapper(const std::string &str = "")
        : iss_(str), state_(), name_("parser"),
          lexer_(&state_, &name_, std::bind(&io::text::InStringStream::GetChar, &iss_))
    {
    }